

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

uint64_t ptls_decode_quicint(uint8_t **src,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  uint bytes_left;
  uint64_t v;
  uint8_t b;
  uint8_t *end_local;
  uint8_t **src_local;
  ulong local_8;
  
  if (*src == end) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    pbVar2 = *src;
    *src = pbVar2 + 1;
    bVar1 = *pbVar2;
    if (bVar1 < 0x40) {
      local_8 = (ulong)bVar1;
    }
    else {
      v = (uint64_t)(int)(bVar1 & 0x3f);
      bytes_left = (1 << (sbyte)((int)(uint)bVar1 >> 6)) - 1;
      if ((ulong)((long)end - (long)*src) < (ulong)bytes_left) {
        local_8 = 0xffffffffffffffff;
      }
      else {
        do {
          pbVar2 = *src;
          *src = pbVar2 + 1;
          v = v << 8 | (ulong)*pbVar2;
          bytes_left = bytes_left - 1;
          local_8 = v;
        } while (bytes_left != 0);
      }
    }
  }
  return local_8;
}

Assistant:

uint64_t ptls_decode_quicint(const uint8_t **src, const uint8_t *end)
{
    if (PTLS_UNLIKELY(*src == end))
        return UINT64_MAX;

    uint8_t b = *(*src)++;

    if (PTLS_LIKELY(b <= 0x3f))
        return b;

    uint64_t v = b & 0x3f;
    unsigned bytes_left = (1 << (b >> 6)) - 1;
    if (PTLS_UNLIKELY((size_t)(end - *src) < bytes_left))
        return UINT64_MAX;
    do {
        v = (v << 8) | *(*src)++;
    } while (--bytes_left != 0);
    return v;
}